

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_sqr.c
# Opt level: O0

void bn_sqr_recursive(unsigned_long *r,unsigned_long *a,int n2,unsigned_long *t)

{
  uint n_00;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *in_RCX;
  int in_EDX;
  unsigned_long *in_RSI;
  ulong *in_RDI;
  unsigned_long *p;
  unsigned_long lo;
  unsigned_long ln;
  int c1;
  int zero;
  int n;
  unsigned_long *in_stack_00000188;
  unsigned_long *in_stack_00000190;
  ulong *local_48;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar5;
  undefined4 in_stack_ffffffffffffffe8;
  
  n_00 = in_EDX / 2;
  if (in_EDX == 4) {
    bn_sqr_comba4(in_RSI,(unsigned_long *)CONCAT44(4,in_stack_ffffffffffffffe8));
  }
  else if (in_EDX == 8) {
    bn_sqr_comba8(in_stack_00000190,in_stack_00000188);
  }
  else if (in_EDX < 0x10) {
    bn_sqr_normal(in_RSI,(unsigned_long *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                  (int)((ulong)in_RCX >> 0x20),
                  (unsigned_long *)CONCAT44(n_00,in_stack_ffffffffffffffd8));
  }
  else {
    iVar1 = bn_cmp_words(in_RSI,in_RSI + (int)n_00,n_00);
    iVar5 = 0;
    if (iVar1 < 1) {
      if (iVar1 < 0) {
        bn_sub_words(in_RCX,in_RSI + (int)n_00,in_RSI,n_00);
      }
      else {
        iVar5 = 1;
      }
    }
    else {
      bn_sub_words(in_RCX,in_RSI,in_RSI + (int)n_00,n_00);
    }
    if (iVar5 == 0) {
      bn_sqr_recursive(in_RSI,(unsigned_long *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                       (int)((ulong)in_RCX >> 0x20),(unsigned_long *)((ulong)n_00 << 0x20));
    }
    else {
      memset(in_RCX + in_EDX,0,(long)in_EDX << 3);
    }
    bn_sqr_recursive(in_RSI,(unsigned_long *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                     (int)((ulong)in_RCX >> 0x20),(unsigned_long *)CONCAT44(n_00,iVar5));
    bn_sqr_recursive(in_RSI,(unsigned_long *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                     (int)((ulong)in_RCX >> 0x20),(unsigned_long *)CONCAT44(n_00,iVar5));
    uVar2 = bn_add_words(in_RCX,in_RDI,in_RDI + in_EDX,in_EDX);
    uVar3 = bn_sub_words(in_RCX + in_EDX,in_RCX,in_RCX + in_EDX,in_EDX);
    uVar4 = bn_add_words(in_RDI + (int)n_00,in_RDI + (int)n_00,in_RCX + in_EDX,in_EDX);
    iVar1 = (int)uVar4 + ((int)uVar2 - (int)uVar3);
    if (iVar1 != 0) {
      local_48 = in_RDI + (int)(n_00 + in_EDX);
      uVar2 = *local_48;
      *local_48 = uVar2 + (long)iVar1;
      if (uVar2 + (long)iVar1 < (ulong)(long)iVar1) {
        do {
          local_48 = local_48 + 1;
          uVar2 = *local_48;
          *local_48 = uVar2 + 1;
        } while (uVar2 + 1 == 0);
      }
    }
  }
  return;
}

Assistant:

void bn_sqr_recursive(BN_ULONG *r, const BN_ULONG *a, int n2, BN_ULONG *t)
{
    int n = n2 / 2;
    int zero, c1;
    BN_ULONG ln, lo, *p;

    if (n2 == 4) {
# ifndef BN_SQR_COMBA
        bn_sqr_normal(r, a, 4, t);
# else
        bn_sqr_comba4(r, a);
# endif
        return;
    } else if (n2 == 8) {
# ifndef BN_SQR_COMBA
        bn_sqr_normal(r, a, 8, t);
# else
        bn_sqr_comba8(r, a);
# endif
        return;
    }
    if (n2 < BN_SQR_RECURSIVE_SIZE_NORMAL) {
        bn_sqr_normal(r, a, n2, t);
        return;
    }
    /* r=(a[0]-a[1])*(a[1]-a[0]) */
    c1 = bn_cmp_words(a, &(a[n]), n);
    zero = 0;
    if (c1 > 0)
        bn_sub_words(t, a, &(a[n]), n);
    else if (c1 < 0)
        bn_sub_words(t, &(a[n]), a, n);
    else
        zero = 1;

    /* The result will always be negative unless it is zero */
    p = &(t[n2 * 2]);

    if (!zero)
        bn_sqr_recursive(&(t[n2]), t, n, p);
    else
        memset(&t[n2], 0, sizeof(*t) * n2);
    bn_sqr_recursive(r, a, n, p);
    bn_sqr_recursive(&(r[n2]), &(a[n]), n, p);

    /*-
     * t[32] holds (a[0]-a[1])*(a[1]-a[0]), it is negative or zero
     * r[10] holds (a[0]*b[0])
     * r[32] holds (b[1]*b[1])
     */

    c1 = (int)(bn_add_words(t, r, &(r[n2]), n2));

    /* t[32] is negative */
    c1 -= (int)(bn_sub_words(&(t[n2]), t, &(t[n2]), n2));

    /*-
     * t[32] holds (a[0]-a[1])*(a[1]-a[0])+(a[0]*a[0])+(a[1]*a[1])
     * r[10] holds (a[0]*a[0])
     * r[32] holds (a[1]*a[1])
     * c1 holds the carry bits
     */
    c1 += (int)(bn_add_words(&(r[n]), &(r[n]), &(t[n2]), n2));
    if (c1) {
        p = &(r[n + n2]);
        lo = *p;
        ln = (lo + c1) & BN_MASK2;
        *p = ln;

        /*
         * The overflow will stop before we over write words we should not
         * overwrite
         */
        if (ln < (BN_ULONG)c1) {
            do {
                p++;
                lo = *p;
                ln = (lo + 1) & BN_MASK2;
                *p = ln;
            } while (ln == 0);
        }
    }
}